

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldsTable.cpp
# Opt level: O0

void __thiscall ser::FieldsTable::TableFromJSON(FieldsTable *this,JSONNode *node)

{
  bool bVar1;
  JSONNode *node_00;
  undefined1 local_d0 [8];
  DataFieldInfo info;
  JSONNode local_20;
  const_iterator iter;
  JSONNode *node_local;
  FieldsTable *this_local;
  
  iter.it = (JSONNode **)node;
  Cleanup(this);
  ::JSONNode::begin(&local_20);
  while( true ) {
    ::JSONNode::end((JSONNode *)
                    &info.metainfo_.data_._M_t._M_impl.super__Rb_tree_header._M_node_count);
    bVar1 = ::JSONNode::const_iterator::operator!=
                      ((const_iterator *)&local_20,
                       (const_iterator *)
                       &info.metainfo_.data_._M_t._M_impl.super__Rb_tree_header._M_node_count);
    if (!bVar1) break;
    DataFieldInfo::DataFieldInfo((DataFieldInfo *)local_d0);
    node_00 = ::JSONNode::const_iterator::operator*((const_iterator *)&local_20);
    DataFieldInfo::FromJSON((DataFieldInfo *)local_d0,node_00);
    RegisterField(this,(DataFieldInfo *)local_d0);
    DataFieldInfo::~DataFieldInfo((DataFieldInfo *)local_d0);
    ::JSONNode::const_iterator::operator++((const_iterator *)&local_20);
  }
  return;
}

Assistant:

void FieldsTable::TableFromJSON(const JSONNode& node)
{
    Cleanup();

    for (JSONNode::const_iterator iter = node.begin(); iter != node.end(); ++iter)
    {
        DataFieldInfo info;
        info.FromJSON(*iter);
        RegisterField(info);
    }
}